

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

TestCase *
deqp::gls::TextureStateQueryTests::createIsTextureTest
          (TestContext *testCtx,RenderContext *renderCtx,string *name,string *description,
          GLenum target)

{
  IsTextureCase *this;
  char *name_00;
  char *desc;
  GLenum target_local;
  string *description_local;
  string *name_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  
  this = (IsTextureCase *)operator_new(0x80);
  name_00 = (char *)std::__cxx11::string::c_str();
  desc = (char *)std::__cxx11::string::c_str();
  anon_unknown_1::IsTextureCase::IsTextureCase(this,testCtx,renderCtx,name_00,desc,target);
  return &this->super_TestCase;
}

Assistant:

tcu::TestCase* createIsTextureTest (tcu::TestContext& testCtx, const glu::RenderContext& renderCtx, const std::string& name, const std::string& description, glw::GLenum target)
{
	return new IsTextureCase(testCtx, renderCtx, name.c_str(), description.c_str(), target);
}